

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O0

bool tcu::floatUlpThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference
               ,ConstPixelBufferAccess *result,UVec4 *threshold,CompareLogMode logMode)

{
  void **this;
  byte bVar1;
  bool bVar2;
  int width_00;
  int height_00;
  deBool dVar3;
  int iVar4;
  TextureChannelClass TVar5;
  TestError *this_00;
  TextureFormat *pTVar6;
  MessageBuilder *pMVar7;
  TestLog *pTVar8;
  allocator<char> local_8e9;
  string local_8e8;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImageSet local_7c0;
  TextureFormat local_77c;
  allocator<char> local_771;
  string local_770;
  allocator<char> local_749;
  string local_748;
  LogImage local_728;
  allocator<char> local_691;
  string local_690;
  allocator<char> local_669;
  string local_668;
  LogImage local_648;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  LogImage local_568;
  allocator<char> local_4d1;
  string local_4d0;
  allocator<char> local_4a9;
  string local_4a8;
  LogImageSet local_488;
  MessageBuilder local_448;
  MessageBuilder local_2c8;
  Vector<bool,_4> local_145;
  byte local_141;
  undefined1 local_140 [7];
  bool compareOk;
  tcu local_130 [19];
  Vector<bool,_4> local_11d;
  byte local_119;
  undefined1 local_118 [7];
  bool isOk;
  UVec4 diff;
  Vec4 cmpPix;
  Vec4 refPix;
  int x;
  int y;
  int z;
  Vec4 pixelScale;
  Vec4 pixelBias;
  UVec4 maxDiff;
  undefined1 local_a0 [8];
  PixelBufferAccess errorMask;
  undefined1 local_70 [8];
  TextureLevel errorMaskStorage;
  int depth;
  int height;
  int width;
  UVec4 *threshold_local;
  ConstPixelBufferAccess *result_local;
  ConstPixelBufferAccess *reference_local;
  char *imageSetDesc_local;
  char *imageSetName_local;
  TestLog *log_local;
  
  width_00 = ConstPixelBufferAccess::getWidth(reference);
  height_00 = ConstPixelBufferAccess::getHeight(reference);
  errorMaskStorage.m_data.m_cap._4_4_ = ConstPixelBufferAccess::getDepth(reference);
  this = &errorMask.super_ConstPixelBufferAccess.m_data;
  TextureFormat::TextureFormat((TextureFormat *)this,RGB,UNORM_INT8);
  TextureLevel::TextureLevel
            ((TextureLevel *)local_70,(TextureFormat *)this,width_00,height_00,
             errorMaskStorage.m_data.m_cap._4_4_);
  TextureLevel::getAccess((PixelBufferAccess *)local_a0,(TextureLevel *)local_70);
  Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),0,0,0,0);
  Vector<float,_4>::Vector((Vector<float,_4> *)(pixelScale.m_data + 2),0.0,0.0,0.0,0.0);
  Vector<float,_4>::Vector((Vector<float,_4> *)&y,1.0,1.0,1.0,1.0);
  do {
    dVar3 = ::deGetFalse();
    if ((((dVar3 != 0) || (iVar4 = ConstPixelBufferAccess::getWidth(result), iVar4 != width_00)) ||
        (iVar4 = ConstPixelBufferAccess::getHeight(result), iVar4 != height_00)) ||
       (iVar4 = ConstPixelBufferAccess::getDepth(result),
       iVar4 != errorMaskStorage.m_data.m_cap._4_4_)) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      TestError::TestError
                (this_00,(char *)0x0,
                 "result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth"
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
                 ,499);
      __cxa_throw(this_00,&TestError::typeinfo,TestError::~TestError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  for (x = 0; x < errorMaskStorage.m_data.m_cap._4_4_; x = x + 1) {
    for (refPix.m_data[3] = 0.0; (int)refPix.m_data[3] < height_00;
        refPix.m_data[3] = (float)((int)refPix.m_data[3] + 1)) {
      for (refPix.m_data[2] = 0.0; (int)refPix.m_data[2] < width_00;
          refPix.m_data[2] = (float)((int)refPix.m_data[2] + 1)) {
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)(cmpPix.m_data + 2),(int)reference,
                   (int)refPix.m_data[2],(int)refPix.m_data[3]);
        ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)(diff.m_data + 2),(int)result,(int)refPix.m_data[2],
                   (int)refPix.m_data[3]);
        computeFlushRelaxedULPDiff
                  ((tcu *)local_118,(Vec4 *)(cmpPix.m_data + 2),(Vec4 *)(diff.m_data + 2));
        lessThanEqual<unsigned_int,4>
                  ((tcu *)&local_11d,(Vector<unsigned_int,_4> *)local_118,threshold);
        local_119 = boolAll<4>(&local_11d);
        max<unsigned_int,4>(local_130,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),
                            (Vector<unsigned_int,_4> *)local_118);
        pixelBias.m_data._8_8_ = local_130._0_8_;
        if ((local_119 & 1) == 0) {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_140,1.0,0.0,0.0,1.0);
        }
        else {
          Vector<float,_4>::Vector((Vector<float,_4> *)local_140,0.0,1.0,0.0,1.0);
        }
        PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)local_a0,(Vec4 *)local_140,(int)refPix.m_data[2],
                   (int)refPix.m_data[3],x);
      }
    }
  }
  lessThanEqual<unsigned_int,4>
            ((tcu *)&local_145,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2),threshold);
  local_141 = boolAll<4>(&local_145);
  if (((bool)local_141) && (logMode != COMPARE_LOG_EVERYTHING)) {
    if (logMode == COMPARE_LOG_RESULT) {
      pTVar6 = ConstPixelBufferAccess::getFormat(result);
      TextureFormat::TextureFormat(&local_77c,RGBA,UNORM_INT8);
      bVar2 = TextureFormat::operator!=(pTVar6,&local_77c);
      if (bVar2) {
        computePixelScaleBias(result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_7e0,imageSetName,&local_7e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_808,imageSetDesc,&local_809);
      LogImageSet::LogImageSet(&local_7c0,&local_7e0,&local_808);
      pTVar8 = TestLog::operator<<(log,&local_7c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"Result",&local_8c1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_8e8,"Result",&local_8e9);
      LogImage::LogImage(&local_8a0,&local_8c0,&local_8e8,result,(Vec4 *)&y,
                         (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
      pTVar8 = TestLog::operator<<(pTVar8,&local_8a0);
      TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
      LogImage::~LogImage(&local_8a0);
      std::__cxx11::string::~string((string *)&local_8e8);
      std::allocator<char>::~allocator(&local_8e9);
      std::__cxx11::string::~string((string *)&local_8c0);
      std::allocator<char>::~allocator(&local_8c1);
      LogImageSet::~LogImageSet(&local_7c0);
      std::__cxx11::string::~string((string *)&local_808);
      std::allocator<char>::~allocator(&local_809);
      std::__cxx11::string::~string((string *)&local_7e0);
      std::allocator<char>::~allocator(&local_7e1);
    }
    goto LAB_00e74e67;
  }
  pTVar6 = ConstPixelBufferAccess::getFormat(reference);
  TVar5 = getTextureChannelClass(pTVar6->type);
  if (TVar5 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    pTVar6 = ConstPixelBufferAccess::getFormat(result);
    TVar5 = getTextureChannelClass(pTVar6->type);
    if (TVar5 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) goto LAB_00e742ef;
  }
  else {
LAB_00e742ef:
    anon_unknown_47::computeScaleAndBias
              (reference,result,(Vec4 *)&y,(Vec4 *)(pixelScale.m_data + 2));
    TestLog::operator<<(&local_2c8,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_2c8,
                        (char (*) [61])
                        "Result and reference images are normalized with formula p * ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)&y);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [4])0xf35fd8);
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<float,_4> *)(pixelScale.m_data + 2));
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_2c8);
  }
  if ((local_141 & 1) == 0) {
    TestLog::operator<<(&local_448,log,(BeginMessageToken *)&TestLog::Message);
    pMVar7 = MessageBuilder::operator<<
                       (&local_448,(char (*) [43])"Image comparison failed: max difference = ");
    pMVar7 = MessageBuilder::operator<<(pMVar7,(Vector<unsigned_int,_4> *)(pixelBias.m_data + 2));
    pMVar7 = MessageBuilder::operator<<(pMVar7,(char (*) [15])0xfacae5);
    pMVar7 = MessageBuilder::operator<<(pMVar7,threshold);
    MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&TestLog::EndMessage);
    MessageBuilder::~MessageBuilder(&local_448);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a8,imageSetName,&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,imageSetDesc,&local_4d1);
  LogImageSet::LogImageSet(&local_488,&local_4a8,&local_4d0);
  pTVar8 = TestLog::operator<<(log,&local_488);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_588,"Result",&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5b0,"Result",&local_5b1);
  LogImage::LogImage(&local_568,&local_588,&local_5b0,result,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_568);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_668,"Reference",&local_669);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_690,"Reference",&local_691);
  LogImage::LogImage(&local_648,&local_668,&local_690,reference,(Vec4 *)&y,
                     (Vec4 *)(pixelScale.m_data + 2),QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_648);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_748,"ErrorMask",&local_749);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_770,"Error mask",&local_771);
  LogImage::LogImage(&local_728,&local_748,&local_770,(ConstPixelBufferAccess *)local_a0,
                     QP_IMAGE_COMPRESSION_MODE_BEST);
  pTVar8 = TestLog::operator<<(pTVar8,&local_728);
  TestLog::operator<<(pTVar8,(EndImageSetToken *)&TestLog::EndImageSet);
  LogImage::~LogImage(&local_728);
  std::__cxx11::string::~string((string *)&local_770);
  std::allocator<char>::~allocator(&local_771);
  std::__cxx11::string::~string((string *)&local_748);
  std::allocator<char>::~allocator(&local_749);
  LogImage::~LogImage(&local_648);
  std::__cxx11::string::~string((string *)&local_690);
  std::allocator<char>::~allocator(&local_691);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator(&local_669);
  LogImage::~LogImage(&local_568);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  LogImageSet::~LogImageSet(&local_488);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator(&local_4a9);
LAB_00e74e67:
  bVar1 = local_141;
  TextureLevel::~TextureLevel((TextureLevel *)local_70);
  return (bool)(bVar1 & 1);
}

Assistant:

bool floatUlpThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, const UVec4& threshold, CompareLogMode logMode)
{
	int					width				= reference.getWidth();
	int					height				= reference.getHeight();
	int					depth				= reference.getDepth();
	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	UVec4				maxDiff				(0, 0, 0, 0);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	TCU_CHECK(result.getWidth() == width && result.getHeight() == height && result.getDepth() == depth);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	refPix	= reference.getPixel(x, y, z);
				const Vec4	cmpPix	= result.getPixel(x, y, z);
				const UVec4	diff	= computeFlushRelaxedULPDiff(refPix, cmpPix);
				const bool	isOk	= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(reference.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT ||
			tcu::getTextureChannelClass(result.getFormat().type)	!= tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(reference, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result and reference images are normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",	reference,	pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}